

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O1

void __thiscall CProfileNode::CleanupMemory(CProfileNode *this)

{
  CProfileNode *pCVar1;
  
  pCVar1 = this->Child;
  if (pCVar1 != (CProfileNode *)0x0) {
    CleanupMemory(pCVar1);
    operator_delete(pCVar1);
  }
  this->Child = (CProfileNode *)0x0;
  pCVar1 = this->Sibling;
  if (pCVar1 != (CProfileNode *)0x0) {
    CleanupMemory(pCVar1);
    operator_delete(pCVar1);
  }
  this->Sibling = (CProfileNode *)0x0;
  return;
}

Assistant:

void	CProfileNode::CleanupMemory()
{
	delete ( Child);
	Child = NULL;
	delete ( Sibling);
	Sibling = NULL;
}